

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

int conn_set_timeout(conn_handle *conn,uint32_t msec)

{
  mutex_handle *mutex;
  int iVar1;
  int *piVar2;
  timeval val;
  
  piVar2 = (int *)conn->priv;
  val.tv_sec = (ulong)msec / 1000;
  val.tv_usec = (__suseconds_t)((msec % 1000) * 1000);
  mutex = (mutex_handle *)(piVar2 + 0x24);
  mutex_lock_shared(mutex);
  iVar1 = setsockopt(*piVar2,1,0x14,&val,0x10);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  mutex_unlock_shared(mutex);
  return iVar1;
}

Assistant:

int conn_set_timeout(struct conn_handle *conn, uint32_t msec)
{
	struct conn_priv *priv = conn->priv;
	int ret;

#ifdef _WIN32
	const DWORD val = msec;
#else
	struct timeval val;

	val.tv_sec = msec / 1000;
	val.tv_usec = (msec % 1000) * 1000;
#endif

	mutex_lock_shared(&priv->mutex);
	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_RCVTIMEO,
			 (const void *)&val, sizeof(val));
	if (ret == SOCKET_ERROR)
		ret = SOCK_ERRNO;

	mutex_unlock_shared(&priv->mutex);

	return ret;
}